

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_sys.c
# Opt level: O1

c_int load_linsys_solver(linsys_solver_type linsys_solver)

{
  c_int cVar1;
  
  if (linsys_solver == MKL_PARDISO_SOLVER) {
    cVar1 = lh_load_pardiso((char *)0x0);
    return cVar1;
  }
  return 0;
}

Assistant:

c_int load_linsys_solver(enum linsys_solver_type linsys_solver) {
  switch (linsys_solver) {
  case QDLDL_SOLVER:

    // We do not load  QDLDL solver. We have the source.
    return 0;

# ifdef ENABLE_MKL_PARDISO
  case MKL_PARDISO_SOLVER:

    // Load Pardiso library
    return lh_load_pardiso(OSQP_NULL);

# endif /* ifdef ENABLE_MKL_PARDISO */
  default: // QDLDL
    return 0;
  }
}